

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

AssertionResult
testing::internal::HasOneFailure
          (char *param_1,char *param_2,char *param_3,TestPartResultArray *results,Type type,
          char *substr)

{
  TestPartResultArray *this;
  void *__dest;
  TestPartResult *pTVar1;
  size_t sVar2;
  scoped_ptr<testing::internal::String> extraout_RDX;
  size_t i;
  long lVar3;
  size_t sVar4;
  int index;
  ostream *poVar5;
  ostream *this_00;
  undefined4 in_register_00000084;
  Type TVar6;
  char *pcVar7;
  Message MVar8;
  AssertionResult AVar9;
  Message msg;
  char *in_stack_00000008;
  Message local_58;
  char local_4b;
  char local_4a;
  char local_49;
  void *local_48;
  testing *local_40;
  TestPartResult *local_38;
  
  TVar6 = (Type)substr;
  this = (TestPartResultArray *)CONCAT44(in_register_00000084,type);
  pcVar7 = "1 non-fatal failure";
  if (TVar6 == kFatalFailure) {
    pcVar7 = "1 fatal failure";
  }
  lVar3 = (ulong)(TVar6 != kFatalFailure) * 4;
  sVar2 = lVar3 + 0xf;
  local_40 = (testing *)param_1;
  __dest = operator_new__(lVar3 + 0x10);
  memcpy(__dest,pcVar7,sVar2);
  *(undefined1 *)((long)__dest + lVar3 + 0xf) = 0;
  local_48 = __dest;
  Message::Message(&local_58);
  if ((*(long *)(this + 8) - *(long *)this & 0x3fffffffc0U) == 0x40) {
    pTVar1 = TestPartResultArray::GetTestPartResult(this,0);
    if (pTVar1->type_ == TVar6) {
      pcVar7 = strstr((pTVar1->message_).c_str_,in_stack_00000008);
      if (pcVar7 != (char *)0x0) {
        *local_40 = (testing)0x1;
        *(undefined8 *)(local_40 + 8) = 0;
        goto LAB_0014f3b0;
      }
      poVar5 = (ostream *)(local_58.ss_ + 0x10);
      if (local_58.ss_ == (StrStream *)0x0) {
        poVar5 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Expected: ",10);
      poVar5 = (ostream *)(local_58.ss_ + 0x10);
      if (local_58.ss_ == (StrStream *)0x0) {
        poVar5 = (ostream *)0x0;
      }
      sVar4 = 0;
      local_38 = pTVar1;
      do {
        if (*(char *)((long)local_48 + sVar4) == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\0",2);
        }
        else {
          local_49 = *(char *)((long)local_48 + sVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_49,1);
        }
        sVar4 = sVar4 + 1;
      } while (sVar2 != sVar4);
      poVar5 = (ostream *)(local_58.ss_ + 0x10);
      if (local_58.ss_ == (StrStream *)0x0) {
        poVar5 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," containing \"",0xd);
      pTVar1 = local_38;
      if (in_stack_00000008 == (char *)0x0) {
        MVar8.ss_ = local_58.ss_ + 0x10;
        sVar2 = 6;
        in_stack_00000008 = "(null)";
      }
      else {
        MVar8.ss_ = local_58.ss_;
        if (local_58.ss_ != (StrStream *)0x0) {
          MVar8.ss_ = (StrStream *)(local_58.ss_ + 0x10);
        }
        sVar2 = strlen(in_stack_00000008);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)MVar8.ss_,in_stack_00000008,sVar2);
      poVar5 = (ostream *)(local_58.ss_ + 0x10);
      if (local_58.ss_ == (StrStream *)0x0) {
        poVar5 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
      poVar5 = (ostream *)(local_58.ss_ + 0x10);
      if (local_58.ss_ == (StrStream *)0x0) {
        poVar5 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Actual:\n",10);
    }
    else {
      poVar5 = (ostream *)(local_58.ss_ + 0x10);
      if (local_58.ss_ == (StrStream *)0x0) {
        poVar5 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Expected: ",10);
      poVar5 = (ostream *)(local_58.ss_ + 0x10);
      if (local_58.ss_ == (StrStream *)0x0) {
        poVar5 = (ostream *)0x0;
      }
      sVar4 = 0;
      do {
        if (*(char *)((long)local_48 + sVar4) == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\0",2);
        }
        else {
          local_4a = *(char *)((long)local_48 + sVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_4a,1);
        }
        sVar4 = sVar4 + 1;
      } while (sVar2 != sVar4);
      poVar5 = (ostream *)(local_58.ss_ + 0x10);
      if (local_58.ss_ == (StrStream *)0x0) {
        poVar5 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      poVar5 = (ostream *)(local_58.ss_ + 0x10);
      if (local_58.ss_ == (StrStream *)0x0) {
        poVar5 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Actual:\n",10);
    }
    poVar5 = (ostream *)(local_58.ss_ + 0x10);
    if (local_58.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    testing::operator<<(poVar5,pTVar1);
    AssertionFailure(local_40,&local_58);
  }
  else {
    poVar5 = (ostream *)(local_58.ss_ + 0x10);
    if (local_58.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Expected: ",10);
    poVar5 = (ostream *)(local_58.ss_ + 0x10);
    if (local_58.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    sVar4 = 0;
    do {
      if (*(char *)((long)local_48 + sVar4) == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\0",2);
      }
      else {
        local_4b = *(char *)((long)local_48 + sVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_4b,1);
      }
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
    poVar5 = (ostream *)(local_58.ss_ + 0x10);
    if (local_58.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    poVar5 = (ostream *)(local_58.ss_ + 0x10);
    if (local_58.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Actual: ",10);
    this_00 = (ostream *)(local_58.ss_ + 0x10);
    if (local_58.ss_ == (StrStream *)0x0) {
      this_00 = (ostream *)0x0;
    }
    std::ostream::operator<<(this_00,(int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6));
    poVar5 = (ostream *)(local_58.ss_ + 0x10);
    if (local_58.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," failures",9);
    if (0 < (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6)) {
      index = 0;
      do {
        poVar5 = (ostream *)(local_58.ss_ + 0x10);
        if (local_58.ss_ == (StrStream *)0x0) {
          poVar5 = (ostream *)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        pTVar1 = TestPartResultArray::GetTestPartResult(this,index);
        poVar5 = (ostream *)(local_58.ss_ + 0x10);
        if (local_58.ss_ == (StrStream *)0x0) {
          poVar5 = (ostream *)0x0;
        }
        testing::operator<<(poVar5,pTVar1);
        index = index + 1;
      } while (index < (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6));
    }
    AssertionFailure(local_40,&local_58);
  }
LAB_0014f3b0:
  if (local_58.ss_ != (StrStream *)0x0) {
    (**(code **)(*(long *)local_58.ss_ + 8))();
  }
  operator_delete__(local_48);
  AVar9.message_.ptr_ = extraout_RDX.ptr_;
  AVar9._0_8_ = local_40;
  return AVar9;
}

Assistant:

AssertionResult HasOneFailure(const char* /* results_expr */,
                              const char* /* type_expr */,
                              const char* /* substr_expr */,
                              const TestPartResultArray& results,
                              TestPartResult::Type type,
                              const char* substr) {
  const String expected(type == TestPartResult::kFatalFailure ?
                        "1 fatal failure" :
                        "1 non-fatal failure");
  Message msg;
  if (results.size() != 1) {
    msg << "Expected: " << expected << "\n"
        << "  Actual: " << results.size() << " failures";
    for (int i = 0; i < results.size(); i++) {
      msg << "\n" << results.GetTestPartResult(i);
    }
    return AssertionFailure(msg);
  }

  const TestPartResult& r = results.GetTestPartResult(0);
  if (r.type() != type) {
    msg << "Expected: " << expected << "\n"
        << "  Actual:\n"
        << r;
    return AssertionFailure(msg);
  }

  if (strstr(r.message(), substr) == NULL) {
    msg << "Expected: " << expected << " containing \""
        << substr << "\"\n"
        << "  Actual:\n"
        << r;
    return AssertionFailure(msg);
  }

  return AssertionSuccess();
}